

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall QtMWidgets::AbstractScrollArea::wheelEvent(AbstractScrollArea *this,QWheelEvent *e)

{
  AbstractScrollAreaPrivate *pAVar1;
  long lVar2;
  uint dy;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar3;
  
  uVar4 = *(ulong *)(e + 0x50);
  lVar2 = *(long *)(e + 0x58);
  QAbstractAnimation::stop();
  QAbstractAnimation::stop();
  if (uVar4 == 0) {
    if (lVar2 == 0) goto LAB_00158350;
    iVar5 = (int)((ulong)lVar2 >> 0x20);
    iVar3 = iVar5 + 7;
    if (-1 < lVar2) {
      iVar3 = iVar5;
    }
    dy = iVar3 >> 3;
    pAVar1 = (this->d).d;
    if (*(int *)(e + 0x20) == 0x2000000) {
      AbstractScrollAreaPrivate::scrollContentsBy(pAVar1,dy,0);
      lVar2 = *(long *)this;
      uVar4 = (ulong)dy;
      goto LAB_0015831c;
    }
    AbstractScrollAreaPrivate::scrollContentsBy(pAVar1,0,dy);
    lVar2 = *(long *)this;
    uVar4 = 0;
    uVar6 = (ulong)dy;
  }
  else {
    uVar6 = uVar4 >> 0x20;
    pAVar1 = (this->d).d;
    iVar5 = (int)(uVar4 >> 0x20);
    if (*(int *)(e + 0x20) == 0x2000000) {
      AbstractScrollAreaPrivate::scrollContentsBy(pAVar1,iVar5,0);
      lVar2 = *(long *)this;
      uVar4 = uVar6;
LAB_0015831c:
      uVar6 = 0;
    }
    else {
      AbstractScrollAreaPrivate::scrollContentsBy(pAVar1,0,iVar5);
      lVar2 = *(long *)this;
      uVar4 = 0;
    }
  }
  (**(code **)(lVar2 + 0x1b0))(this,uVar4,uVar6);
LAB_00158350:
  pAVar1 = (this->d).d;
  if ((pAVar1->horIndicator->policy == ScrollIndicatorAsNeeded) ||
     (pAVar1->vertIndicator->policy == ScrollIndicatorAsNeeded)) {
    AbstractScrollAreaPrivate::animateScrollIndicators(pAVar1);
  }
  QTimer::stop();
  QTimer::start((int)((this->d).d)->startBlurAnimTimer);
  e[0xc] = (QWheelEvent)0x1;
  return;
}

Assistant:

void
AbstractScrollArea::wheelEvent( QWheelEvent * e )
{
	QPoint numPixels = e->pixelDelta();
	QPoint numDegrees = e->angleDelta();

	d->stopAnimatingBlurEffect();

	if( !numPixels.isNull() )
	{
		if( e->modifiers() == Qt::ShiftModifier )
		{
			d->scrollContentsBy( numPixels.y(), 0 );
			scrollContentsBy( numPixels.y(), 0 );
		}
		else
		{
			d->scrollContentsBy( 0, numPixels.y() );
			scrollContentsBy( 0, numPixels.y() );
		}
	}
	else if( !numDegrees.isNull() )
	{
		if( e->modifiers() == Qt::ShiftModifier )
		{
			d->scrollContentsBy( numDegrees.y() / 8, 0 );
			scrollContentsBy( numDegrees.y() / 8, 0 );
		}
		else
		{
			d->scrollContentsBy( 0, numDegrees.y() / 8 );
			scrollContentsBy( 0, numDegrees.y() / 8 );
		}
	}

	if( d->horIndicator->policy == ScrollIndicatorAsNeeded ||
		d->vertIndicator->policy == ScrollIndicatorAsNeeded )
			d->animateScrollIndicators();

	d->startBlurAnimTimer->stop();
	d->startBlurAnimTimer->start( d->animationTimeout );

	e->accept();
}